

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O0

void __thiscall
despot::SimpleRockSampleParticleUpperBound::SimpleRockSampleParticleUpperBound
          (SimpleRockSampleParticleUpperBound *this,DSPOMDP *model)

{
  reference pvVar1;
  reference pvVar2;
  double dVar3;
  double dVar4;
  value_type_conflict local_58;
  value_type_conflict local_50;
  double local_48;
  value_type_conflict local_40;
  double local_38;
  double local_30 [3];
  DSPOMDP *local_18;
  DSPOMDP *model_local;
  SimpleRockSampleParticleUpperBound *this_local;
  
  local_18 = model;
  model_local = (DSPOMDP *)this;
  despot::ParticleUpperBound::ParticleUpperBound(&this->super_ParticleUpperBound);
  *(undefined ***)this = &PTR__SimpleRockSampleParticleUpperBound_0011ac60;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->upper_bounds_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->upper_bounds_,3);
  pvVar1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->upper_bounds_,0);
  local_30[0] = Globals::Discount(1);
  local_30[0] = local_30[0] * 10.0;
  std::vector<double,_std::allocator<double>_>::push_back(pvVar1,local_30);
  pvVar1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->upper_bounds_,0);
  dVar3 = Globals::Discount(2);
  local_38 = dVar3 * 10.0 + 10.0;
  std::vector<double,_std::allocator<double>_>::push_back(pvVar1,&local_38);
  pvVar1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->upper_bounds_,1);
  local_40 = 10.0;
  std::vector<double,_std::allocator<double>_>::push_back(pvVar1,&local_40);
  pvVar1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->upper_bounds_,1);
  dVar3 = Globals::Discount(1);
  dVar4 = Globals::Discount(3);
  local_48 = dVar3 * 10.0 + dVar4 * 10.0;
  std::vector<double,_std::allocator<double>_>::push_back(pvVar1,&local_48);
  pvVar1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->upper_bounds_,1);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,1);
  if (*pvVar2 <= 10.0 && *pvVar2 != 10.0) {
    pvVar1 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->upper_bounds_,1);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,1);
    *pvVar2 = 10.0;
  }
  pvVar1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->upper_bounds_,2);
  local_50 = 0.0;
  std::vector<double,_std::allocator<double>_>::push_back(pvVar1,&local_50);
  pvVar1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->upper_bounds_,2);
  local_58 = 0.0;
  std::vector<double,_std::allocator<double>_>::push_back(pvVar1,&local_58);
  return;
}

Assistant:

SimpleRockSampleParticleUpperBound(const DSPOMDP* model) {
		upper_bounds_.resize(3);
		upper_bounds_[0].push_back(Globals::Discount(1) * 10);
		upper_bounds_[0].push_back(10 + Globals::Discount(2) * 10);
		upper_bounds_[1].push_back(10);
		upper_bounds_[1].push_back(Globals::Discount(1) * 10 + Globals::Discount(3) * 10);
		if (upper_bounds_[1][1] < 10)
			upper_bounds_[1][1] = 10;
		upper_bounds_[2].push_back(0);
		upper_bounds_[2].push_back(0);
	}